

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::AddPaperdollData(Character *this,PacketBuilder *builder,char *format)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  EIF_Data *pEVar4;
  EIF_Data *pEVar5;
  uint uVar6;
  char *p;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  pEVar4 = EIF::Get(this->world->eif,(this->paperdoll)._M_elems[8]);
  pEVar5 = EIF::Get(this->world->eif,(this->paperdoll)._M_elems[0]);
  uVar7 = (pEVar5->field_25).scrollmap;
  pEVar5 = EIF::Get(this->world->eif,(this->paperdoll)._M_elems[4]);
  uVar9 = (pEVar5->field_25).scrollmap;
  pEVar5 = EIF::Get(this->world->eif,(this->paperdoll)._M_elems[6]);
  uVar8 = (pEVar5->field_25).scrollmap;
  uVar6 = (pEVar4->field_25).scrollmap;
  pEVar5 = EIF::Get(this->world->eif,(this->paperdoll)._M_elems[7]);
  uVar10 = (uint)(pEVar4->field_27).scrolly;
  if ((pEVar4->field_27).scrolly == 0) {
    uVar10 = (pEVar5->field_25).scrollmap;
  }
  if (pEVar4->subtype != TwoHanded) {
    uVar10 = (pEVar5->field_25).scrollmap;
  }
  uVar2 = (this->cosmetic_paperdoll)._M_elems[0];
  uVar3 = (this->cosmetic_paperdoll)._M_elems[4];
  if (uVar2 != 0) {
    uVar7 = uVar2;
  }
  if (uVar3 != 0) {
    uVar9 = uVar3;
  }
  uVar2 = (this->cosmetic_paperdoll)._M_elems[6];
  if (uVar2 != 0) {
    uVar8 = uVar2;
  }
  uVar2 = (this->cosmetic_paperdoll)._M_elems[8];
  if (uVar2 != 0) {
    uVar6 = uVar2;
  }
  uVar2 = (this->cosmetic_paperdoll)._M_elems[7];
  if (uVar2 != 0) {
    uVar10 = uVar2;
  }
  uVar7 = uVar7 & 0xffff;
  uVar9 = uVar9 & 0xffff;
  uVar6 = uVar6 & 0xffff;
  if ((short)uVar10 == -1) {
    uVar10 = 0;
  }
  if (uVar6 == 0xffff) {
    uVar6 = 0;
  }
  uVar2 = uVar8 & 0xffff;
  if ((uVar8 & 0xffff) == 0xffff) {
    uVar2 = 0;
  }
  if (uVar9 == 0xffff) {
    uVar9 = 0;
  }
  if (uVar7 == 0xffff) {
    uVar7 = 0;
  }
  do {
    cVar1 = *format;
    if (cVar1 == '0') {
      uVar8 = 0;
LAB_0011231f:
      PacketBuilder::AddShort(builder,uVar8);
    }
    else {
      uVar8 = uVar9;
      if ((((cVar1 == 'A') || (uVar8 = uVar7, cVar1 == 'B')) || (uVar8 = uVar2, cVar1 == 'H')) ||
         ((uVar8 = uVar10 & 0xffff, cVar1 == 'S' || (uVar8 = uVar6, cVar1 == 'W'))))
      goto LAB_0011231f;
      if (cVar1 == '\0') {
        return;
      }
    }
    format = format + 1;
  } while( true );
}

Assistant:

void Character::AddPaperdollData(PacketBuilder& builder, const char* format)
{
	const EIF_Data& wep = this->world->eif->Get(this->paperdoll[Character::Weapon]);

	unsigned short boots = this->world->eif->Get(this->paperdoll[Character::Boots]).dollgraphic;
	unsigned short armor = this->world->eif->Get(this->paperdoll[Character::Armor]).dollgraphic;
	unsigned short hat = this->world->eif->Get(this->paperdoll[Character::Hat]).dollgraphic;
	unsigned short weapon = wep.dollgraphic;
	unsigned short shield = this->world->eif->Get(this->paperdoll[Character::Shield]).dollgraphic;

	if (wep.subtype == EIF::TwoHanded && wep.dual_wield_dollgraphic)
		shield = wep.dual_wield_dollgraphic;

	if (this->cosmetic_paperdoll[Character::Boots])  boots = this->cosmetic_paperdoll[Character::Boots];
	if (this->cosmetic_paperdoll[Character::Armor])  armor = this->cosmetic_paperdoll[Character::Armor];
	if (this->cosmetic_paperdoll[Character::Hat])    hat = this->cosmetic_paperdoll[Character::Hat];
	if (this->cosmetic_paperdoll[Character::Weapon]) weapon = this->cosmetic_paperdoll[Character::Weapon];
	if (this->cosmetic_paperdoll[Character::Shield]) shield = this->cosmetic_paperdoll[Character::Shield];

	if (boots == 65535)  boots = 0;
	if (armor == 65535)  armor = 0;
	if (hat == 65535)    hat = 0;
	if (weapon == 65535) weapon = 0;
	if (shield == 65535) shield = 0;

	for (const char* p = format; *p != '\0'; ++p)
	{
		switch (*p)
		{
			case 'B': builder.AddShort(boots); break;
			case 'A': builder.AddShort(armor); break;
			case 'H': builder.AddShort(hat); break;
			case 'W': builder.AddShort(weapon); break;
			case 'S': builder.AddShort(shield); break;
			case '0': builder.AddShort(0); break;
		}
	}
}